

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

uvec4 ImageCodec::decodeUINT_UINTPacked<unsigned_char>(ImageCodec *codec,void *ptr)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vec<4,_unsigned_int,_(glm::precision)0> *pvVar4;
  const_reference pvVar5;
  uint *puVar6;
  long in_RSI;
  long in_RDI;
  value_type *info;
  size_t i;
  uchar *data;
  uvec4 result;
  vec<4,_unsigned_int,_(glm::precision)0> *pvVar7;
  vec<4,_unsigned_int,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3 local_10;
  
  glm::vec<4,unsigned_int,(glm::precision)0>::vec<int,int,int,int>
            ((vec<4,unsigned_int,(glm::precision)0> *)&local_10.field_0,0,0,0,0);
  pvVar7 = (vec<4,_unsigned_int,_(glm::precision)0> *)0x0;
  while( true ) {
    this = pvVar7;
    pvVar4 = (vec<4,_unsigned_int,_(glm::precision)0> *)
             std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::size
                       ((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                        (in_RDI + 0x28));
    if (pvVar4 <= pvVar7) break;
    pvVar5 = std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::
             operator[]((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                        (in_RDI + 0x28),(size_type)this);
    bVar1 = *(byte *)(in_RSI + (ulong)pvVar5->elementIndex);
    uVar2 = pvVar5->bitOffset;
    uVar3 = pvVar5->bitLength;
    puVar6 = glm::vec<4,_unsigned_int,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)pvVar5 >> 0x20));
    *puVar6 = (int)(uint)bVar1 >> ((byte)uVar2 & 0x1f) & (1 << ((byte)uVar3 & 0x1f)) - 1U;
    pvVar7 = (vec<4,_unsigned_int,_(glm::precision)0> *)((long)&this->field_0 + 1);
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            result[static_cast<glm::length_t>(i)] = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
        }
        return result;
    }